

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O2

int generate_v3(CBB *cbb,char *str,X509V3_CTX *cnf,CBS_ASN1_TAG tag,int format,int depth)

{
  long lVar1;
  int iVar2;
  CBS_ASN1_TAG CVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  OPENSSL_STACK *sk;
  size_t sVar8;
  void *pvVar9;
  ASN1_INTEGER *a;
  ulong uVar10;
  ASN1_OBJECT *a_00;
  ASN1_BIT_STRING *a_01;
  size_t sVar11;
  uchar *data;
  long lVar12;
  ASN1_STRING *data_00;
  int line;
  size_t i;
  ulong i_00;
  CBB *__s;
  CBB *str_00;
  CBS_ASN1_TAG local_a4;
  uint local_a0;
  uint8_t v;
  size_t local_88;
  X509V3_CTX *local_80;
  CBS name;
  CBB child;
  
  uVar10 = (ulong)(uint)depth;
  if (format < 0x33) {
    local_a0 = 0;
    __s = (CBB *)str;
    local_80 = (X509V3_CTX *)cnf;
    local_a4 = tag;
LAB_00487e9b:
    do {
      while ((*(byte *)&__s->child != 0 &&
             (iVar2 = OPENSSL_isspace((uint)*(byte *)&__s->child), iVar2 != 0))) {
        str = (char *)((long)&((CBB *)str)->child + 1);
        __s = (CBB *)((long)&__s->child + 1);
      }
      pcVar7 = strchr((char *)__s,0x2c);
      if (pcVar7 == (char *)0x0) {
LAB_004881d8:
        pcVar7 = strchr((char *)__s,0x3a);
        if (pcVar7 == (char *)0x0) {
          name.len = strlen((char *)__s);
          data_00 = (ASN1_STRING *)0x4951bf;
        }
        else {
          name.len = (long)pcVar7 - (long)str;
          data_00 = (ASN1_STRING *)(pcVar7 + 1);
        }
        lVar1 = 0;
        name.data = (uint8_t *)__s;
        goto LAB_0048821c;
      }
      child._8_8_ = (long)pcVar7 - (long)str;
      child.child = __s;
      while( true ) {
        name.data = (uint8_t *)child.child;
        name.len = child._8_8_;
        iVar2 = CBS_get_last_u8(&name,&v);
        if (iVar2 == 0) break;
        iVar2 = OPENSSL_isspace((uint)v);
        if (iVar2 == 0) break;
        child.child = (CBB *)name.data;
        child._8_8_ = name.len;
      }
      iVar2 = CBS_get_until_first((CBS *)&child,&name,':');
      if (iVar2 == 0) {
        name.data = (uint8_t *)child.child;
        name.len = child._8_8_;
        child.child = (CBB *)0x0;
        child.is_child = '\0';
        child._9_7_ = 0;
      }
      else {
        CBS_skip((CBS *)&child,1);
      }
      str_00 = (CBB *)(pcVar7 + 1);
      iVar2 = cbs_str_equal(&name,"FORMAT");
      if ((iVar2 == 0) && (iVar2 = cbs_str_equal(&name,"FORM"), iVar2 == 0)) {
        iVar2 = cbs_str_equal(&name,"IMP");
        if ((iVar2 == 0) && (iVar2 = cbs_str_equal(&name,"IMPLICIT"), iVar2 == 0)) {
          iVar2 = cbs_str_equal(&name,"EXP");
          if ((iVar2 == 0) && (iVar2 = cbs_str_equal(&name,"EXPLICIT"), iVar2 == 0)) {
            iVar2 = cbs_str_equal(&name,"OCTWRAP");
            if (iVar2 == 0) {
              iVar2 = cbs_str_equal(&name,"BITWRAP");
              if (iVar2 != 0) {
                uVar4 = 3;
                if (local_a0 != 0) {
                  uVar4 = local_a0;
                }
                iVar2 = 1;
                goto LAB_00488176;
              }
              iVar2 = cbs_str_equal(&name,"SEQWRAP");
              if (iVar2 == 0) {
                iVar2 = cbs_str_equal(&name,"SETWRAP");
                if (iVar2 == 0) goto LAB_004881d8;
                uVar5 = local_a0 | 0x20000000;
                uVar4 = 0x20000011;
              }
              else {
                uVar5 = local_a0 | 0x20000000;
                uVar4 = 0x20000010;
              }
            }
            else {
              uVar4 = 4;
              uVar5 = local_a0;
            }
            if (local_a0 != 0) {
              uVar4 = uVar5;
            }
            iVar2 = 0;
LAB_00488176:
            iVar2 = generate_wrapped(cbb,(char *)str_00,(X509V3_CTX *)local_80,uVar4,iVar2,local_a4,
                                     format);
            return iVar2;
          }
          if (local_a0 == 0) {
            CVar3 = parse_tag((CBS *)&child);
            if (CVar3 == 0) {
              return 0;
            }
            uVar4 = CVar3 | 0x20000000;
            iVar2 = 0;
            goto LAB_00488176;
          }
          iVar2 = 0x83;
          line = 0xdd;
          goto LAB_004882cb;
        }
        if (local_a0 != 0) {
          iVar2 = 0x83;
          line = 0xd1;
          goto LAB_004882cb;
        }
        local_a0 = parse_tag((CBS *)&child);
        str = (char *)str_00;
        __s = str_00;
        if (local_a0 == 0) {
          return 0;
        }
        goto LAB_00487e9b;
      }
      iVar2 = cbs_str_equal((CBS *)&child,"ASCII");
      if (iVar2 != 0) {
        local_a4 = 1;
        str = (char *)str_00;
        __s = str_00;
        goto LAB_00487e9b;
      }
      iVar2 = cbs_str_equal((CBS *)&child,"UTF8");
      if (iVar2 != 0) {
        local_a4 = 2;
        str = (char *)str_00;
        __s = str_00;
        goto LAB_00487e9b;
      }
      iVar2 = cbs_str_equal((CBS *)&child,"HEX");
      if (iVar2 != 0) {
        local_a4 = 3;
        str = (char *)str_00;
        __s = str_00;
        goto LAB_00487e9b;
      }
      iVar2 = cbs_str_equal((CBS *)&child,"BITLIST");
      local_a4 = 4;
      str = (char *)str_00;
      __s = str_00;
    } while (iVar2 != 0);
    iVar2 = 0xb6;
    line = 0xcb;
  }
  else {
    iVar2 = 0x83;
    line = 0x93;
  }
  goto LAB_004882cb;
  while (iVar2 = cbs_str_equal(&name,*(char **)((long)&generate_v3::kTypes[0].name + lVar12)),
        lVar1 = lVar12 + 0x10, iVar2 == 0) {
LAB_0048821c:
    lVar12 = lVar1;
    if (lVar12 + 0x10 == 0x220) goto LAB_004882b1;
  }
  uVar4 = *(uint *)((long)&generate_v3::kTypes[0].type + lVar12);
  if (uVar4 == 0) {
LAB_004882b1:
    iVar2 = 0xb9;
    line = 0x135;
    goto LAB_004882cb;
  }
  CVar3 = uVar4 & 0x20000000 | local_a0;
  if (local_a0 == 0) {
    CVar3 = uVar4;
  }
  iVar2 = CBB_add_asn1(cbb,&child,CVar3);
  if (iVar2 == 0) {
    return 0;
  }
  switch(uVar4) {
  case 1:
    if (local_a4 != 1) {
      iVar2 = 0xa1;
      line = 0x14a;
      break;
    }
    iVar2 = X509V3_bool_from_string((char *)data_00,(ASN1_BOOLEAN *)&v);
    if (iVar2 == 0) {
      iVar2 = 0x7d;
      line = 0x14f;
      break;
    }
    iVar2 = CBB_add_u8(&child,-(_v != 0));
    goto LAB_0048878f;
  case 2:
  case 10:
    if (local_a4 == 1) {
      uVar4 = 0;
      a = s2i_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,(char *)data_00);
      if (a != (ASN1_INTEGER *)0x0) {
        uVar5 = i2c_ASN1_INTEGER(a,(uchar **)0x0);
        if (((0 < (int)uVar5) &&
            (iVar2 = CBB_add_space(&child,(uint8_t **)&v,(ulong)uVar5), iVar2 != 0)) &&
           (uVar6 = i2c_ASN1_INTEGER(a,(uchar **)&v), uVar6 == uVar5)) {
          iVar2 = CBB_flush(cbb);
          uVar4 = (uint)(iVar2 != 0);
        }
        ASN1_INTEGER_free(a);
        return uVar4;
      }
      iVar2 = 0x82;
      line = 0x15d;
    }
    else {
      iVar2 = 0x8b;
      line = 0x158;
    }
    break;
  case 3:
    if (local_a4 == 4) {
      a_01 = ASN1_BIT_STRING_new();
      if (a_01 != (ASN1_BIT_STRING *)0x0) {
        iVar2 = CONF_parse_list((char *)data_00,0x2c,1,bitstr_cb,a_01);
        if (iVar2 == 0) {
          uVar4 = 0;
          ERR_put_error(0xc,0,0x97,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                        ,0x1b3);
        }
        else {
          uVar4 = 0;
          uVar5 = i2c_ASN1_BIT_STRING(a_01,(uchar **)0x0);
          if (((0 < (int)uVar5) &&
              (iVar2 = CBB_add_space(&child,(uint8_t **)&v,(ulong)uVar5), iVar2 != 0)) &&
             (uVar6 = i2c_ASN1_BIT_STRING(a_01,(uchar **)&v), uVar6 == uVar5)) {
            iVar2 = CBB_flush(cbb);
            uVar4 = (uint)(iVar2 != 0);
          }
        }
        ASN1_BIT_STRING_free(a_01);
        return uVar4;
      }
      return 0;
    }
    iVar2 = CBB_add_u8(&child,'\0');
    if (iVar2 == 0) {
      return 0;
    }
  case 4:
    if (local_a4 == 3) {
      data = x509v3_hex_to_bytes((char *)data_00,(size_t *)&v);
      if (data != (uchar *)0x0) {
        iVar2 = CBB_add_bytes(&child,data,(size_t)_v);
        if (iVar2 == 0) {
          uVar4 = 0;
        }
        else {
          iVar2 = CBB_flush(cbb);
          uVar4 = (uint)(iVar2 != 0);
        }
        OPENSSL_free(data);
        return uVar4;
      }
      iVar2 = 0x80;
      line = 0x1d1;
    }
    else {
      if (local_a4 == 1) {
        sVar11 = strlen((char *)data_00);
        iVar2 = CBB_add_bytes(&child,(uint8_t *)data_00,sVar11);
LAB_0048878f:
        if (iVar2 == 0) {
          return 0;
        }
LAB_0048879a:
        iVar2 = CBB_flush(cbb);
        return (uint)(iVar2 != 0);
      }
      iVar2 = 0x7c;
      line = 0x1d9;
    }
    break;
  case 5:
    if ((uchar)data_00->length == '\0') {
LAB_0048887a:
      iVar2 = CBB_flush(cbb);
      return iVar2;
    }
    iVar2 = 0x85;
    line = 0x143;
    break;
  case 6:
    if (local_a4 == 1) {
      a_00 = OBJ_txt2obj((char *)data_00,0);
      if ((a_00 != (ASN1_OBJECT *)0x0) && ((long)a_00->length != 0)) {
        iVar2 = CBB_add_bytes(&child,a_00->data,(long)a_00->length);
        if (iVar2 == 0) {
          uVar4 = 0;
        }
        else {
          iVar2 = CBB_flush(cbb);
          uVar4 = (uint)(iVar2 != 0);
        }
        ASN1_OBJECT_free(a_00);
        return uVar4;
      }
      iVar2 = 0x86;
      line = 0x170;
    }
    else {
      iVar2 = 0xa5;
      line = 0x16b;
    }
    break;
  case 0xc:
  case 0x13:
  case 0x14:
  case 0x16:
  case 0x1c:
  case 0x1e:
    if (local_a4 == 1) {
      iVar2 = 0x1001;
    }
    else {
      if (local_a4 != 2) {
        iVar2 = 0x7f;
        line = 0x199;
        break;
      }
      iVar2 = 0x1000;
    }
    _v = (ASN1_STRING *)0x0;
    uVar10 = ASN1_tag2bit(uVar4);
    iVar2 = ASN1_mbstring_ncopy((ASN1_STRING **)&v,(uchar *)data_00,-1,iVar2,uVar10,0,0x10000);
    if (0 < iVar2) {
      iVar2 = CBB_add_bytes(&child,_v->data,(long)_v->length);
      if (iVar2 == 0) {
        uVar4 = 0;
      }
      else {
        iVar2 = CBB_flush(cbb);
        uVar4 = (uint)(iVar2 != 0);
      }
      ASN1_STRING_free(_v);
      return uVar4;
    }
    return 0;
  case 0x17:
  case 0x18:
    if (local_a4 != 1) {
      iVar2 = 0xb0;
      line = 0x17b;
      break;
    }
    local_88 = strlen((char *)data_00);
    _v = data_00;
    if (uVar4 == 0x17) {
      iVar2 = CBS_parse_utc_time((CBS *)&v,(tm *)0x0,0);
    }
    else {
      iVar2 = CBS_parse_generalized_time((CBS *)&v,(tm *)0x0,0);
    }
    if (iVar2 == 0) {
      iVar2 = 0x8a;
      line = 0x186;
      break;
    }
    sVar11 = strlen((char *)data_00);
    iVar2 = CBB_add_bytes(&child,(uint8_t *)data_00,sVar11);
    if (iVar2 == 0) {
      return 0;
    }
    goto LAB_0048879a;
  default:
    if (uVar4 + 0xdffffff0 < 2) {
      if (pcVar7 == (char *)0x0) {
LAB_004886b0:
        if (uVar4 == 0x20000011) {
          iVar2 = CBB_flush_asn1_set_of(&child);
          if (iVar2 == 0) {
            return 0;
          }
          goto LAB_0048879a;
        }
        goto LAB_0048887a;
      }
      if (local_80 == (X509V3_CTX *)0x0) {
        iVar2 = 0xaa;
        line = 0x1e0;
      }
      else {
        sk = (OPENSSL_STACK *)X509V3_get_section(local_80,(char *)data_00);
        if (sk == (OPENSSL_STACK *)0x0) {
          iVar2 = 0xaa;
          line = 0x1e5;
        }
        else {
          i_00 = 0;
          do {
            sVar8 = OPENSSL_sk_num(sk);
            if (sVar8 <= i_00) goto LAB_004886b0;
            pvVar9 = OPENSSL_sk_value(sk,i_00);
            iVar2 = generate_v3(&child,*(char **)((long)pvVar9 + 0x10),(X509V3_CTX *)local_80,1,
                                format + 1,(int)uVar10);
            if (iVar2 == 0) {
              return 0;
            }
            sVar8 = CBB_len(&child);
            i_00 = i_00 + 1;
          } while (sVar8 < 0x10001);
          iVar2 = 0xb1;
          line = 0x1f2;
        }
      }
      break;
    }
  case 7:
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x15:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1d:
    iVar2 = 0x44;
    line = 0x1fe;
  }
LAB_004882cb:
  ERR_put_error(0xc,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                ,line);
  return 0;
}

Assistant:

static int generate_v3(CBB *cbb, const char *str, const X509V3_CTX *cnf,
                       CBS_ASN1_TAG tag, int format, int depth) {
  assert((tag & CBS_ASN1_CONSTRUCTED) == 0);
  if (depth > ASN1_GEN_MAX_DEPTH) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
    return 0;
  }

  // Process modifiers. This function uses a mix of NUL-terminated strings and
  // |CBS|. Several functions only work with NUL-terminated strings, so we need
  // to keep track of when a slice spans the whole buffer.
  for (;;) {
    // Skip whitespace.
    while (*str != '\0' && OPENSSL_isspace((unsigned char)*str)) {
      str++;
    }

    // Modifiers end at commas.
    const char *comma = strchr(str, ',');
    if (comma == NULL) {
      break;
    }

    // Remove trailing whitespace.
    CBS modifier;
    CBS_init(&modifier, (const uint8_t *)str, comma - str);
    for (;;) {
      uint8_t v;
      CBS copy = modifier;
      if (!CBS_get_last_u8(&copy, &v) || !OPENSSL_isspace(v)) {
        break;
      }
      modifier = copy;
    }

    // Advance the string past the modifier, but save the original value. We
    // will need to rewind if this is not a recognized modifier.
    const char *str_old = str;
    str = comma + 1;

    // Each modifier is either NAME:VALUE or NAME.
    CBS name;
    int has_value = CBS_get_until_first(&modifier, &name, ':');
    if (has_value) {
      CBS_skip(&modifier, 1);  // Skip the colon.
    } else {
      name = modifier;
      CBS_init(&modifier, NULL, 0);
    }

    if (cbs_str_equal(&name, "FORMAT") || cbs_str_equal(&name, "FORM")) {
      if (cbs_str_equal(&modifier, "ASCII")) {
        format = ASN1_GEN_FORMAT_ASCII;
      } else if (cbs_str_equal(&modifier, "UTF8")) {
        format = ASN1_GEN_FORMAT_UTF8;
      } else if (cbs_str_equal(&modifier, "HEX")) {
        format = ASN1_GEN_FORMAT_HEX;
      } else if (cbs_str_equal(&modifier, "BITLIST")) {
        format = ASN1_GEN_FORMAT_BITLIST;
      } else {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_FORMAT);
        return 0;
      }
    } else if (cbs_str_equal(&name, "IMP") ||
               cbs_str_equal(&name, "IMPLICIT")) {
      if (tag != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
        return 0;
      }
      tag = parse_tag(&modifier);
      if (tag == 0) {
        return 0;
      }
    } else if (cbs_str_equal(&name, "EXP") ||
               cbs_str_equal(&name, "EXPLICIT")) {
      // It would actually be supportable, but OpenSSL does not allow wrapping
      // an explicit tag in an implicit tag.
      if (tag != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
        return 0;
      }
      tag = parse_tag(&modifier);
      return tag != 0 &&
             generate_wrapped(cbb, str, cnf, tag | CBS_ASN1_CONSTRUCTED,
                              /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "OCTWRAP")) {
      tag = tag == 0 ? CBS_ASN1_OCTETSTRING : tag;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "BITWRAP")) {
      tag = tag == 0 ? CBS_ASN1_BITSTRING : tag;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/1, format, depth);
    } else if (cbs_str_equal(&name, "SEQWRAP")) {
      tag = tag == 0 ? CBS_ASN1_SEQUENCE : (tag | CBS_ASN1_CONSTRUCTED);
      tag |= CBS_ASN1_CONSTRUCTED;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "SETWRAP")) {
      tag = tag == 0 ? CBS_ASN1_SET : (tag | CBS_ASN1_CONSTRUCTED);
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else {
      // If this was not a recognized modifier, rewind |str| to before splitting
      // on the comma. The type itself consumes all remaining input.
      str = str_old;
      break;
    }
  }

  // The final element is, like modifiers, NAME:VALUE or NAME, but VALUE spans
  // the length of the string, including any commas.
  const char *colon = strchr(str, ':');
  CBS name;
  const char *value;
  int has_value = colon != NULL;
  if (has_value) {
    CBS_init(&name, (const uint8_t *)str, colon - str);
    value = colon + 1;
  } else {
    CBS_init(&name, (const uint8_t *)str, strlen(str));
    value = "";  // Most types treat missing and empty value equivalently.
  }

  static const struct {
    const char *name;
    CBS_ASN1_TAG type;
  } kTypes[] = {
      {"BOOL", CBS_ASN1_BOOLEAN},
      {"BOOLEAN", CBS_ASN1_BOOLEAN},
      {"NULL", CBS_ASN1_NULL},
      {"INT", CBS_ASN1_INTEGER},
      {"INTEGER", CBS_ASN1_INTEGER},
      {"ENUM", CBS_ASN1_ENUMERATED},
      {"ENUMERATED", CBS_ASN1_ENUMERATED},
      {"OID", CBS_ASN1_OBJECT},
      {"OBJECT", CBS_ASN1_OBJECT},
      {"UTCTIME", CBS_ASN1_UTCTIME},
      {"UTC", CBS_ASN1_UTCTIME},
      {"GENERALIZEDTIME", CBS_ASN1_GENERALIZEDTIME},
      {"GENTIME", CBS_ASN1_GENERALIZEDTIME},
      {"OCT", CBS_ASN1_OCTETSTRING},
      {"OCTETSTRING", CBS_ASN1_OCTETSTRING},
      {"BITSTR", CBS_ASN1_BITSTRING},
      {"BITSTRING", CBS_ASN1_BITSTRING},
      {"UNIVERSALSTRING", CBS_ASN1_UNIVERSALSTRING},
      {"UNIV", CBS_ASN1_UNIVERSALSTRING},
      {"IA5", CBS_ASN1_IA5STRING},
      {"IA5STRING", CBS_ASN1_IA5STRING},
      {"UTF8", CBS_ASN1_UTF8STRING},
      {"UTF8String", CBS_ASN1_UTF8STRING},
      {"BMP", CBS_ASN1_BMPSTRING},
      {"BMPSTRING", CBS_ASN1_BMPSTRING},
      {"PRINTABLESTRING", CBS_ASN1_PRINTABLESTRING},
      {"PRINTABLE", CBS_ASN1_PRINTABLESTRING},
      {"T61", CBS_ASN1_T61STRING},
      {"T61STRING", CBS_ASN1_T61STRING},
      {"TELETEXSTRING", CBS_ASN1_T61STRING},
      {"SEQUENCE", CBS_ASN1_SEQUENCE},
      {"SEQ", CBS_ASN1_SEQUENCE},
      {"SET", CBS_ASN1_SET},
  };
  CBS_ASN1_TAG type = 0;
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTypes); i++) {
    if (cbs_str_equal(&name, kTypes[i].name)) {
      type = kTypes[i].type;
      break;
    }
  }
  if (type == 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_TAG);
    return 0;
  }

  // If there is an implicit tag, use the constructed bit from the base type.
  tag = tag == 0 ? type : (tag | (type & CBS_ASN1_CONSTRUCTED));
  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    return 0;
  }

  switch (type) {
    case CBS_ASN1_NULL:
      if (*value != '\0') {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NULL_VALUE);
        return 0;
      }
      return CBB_flush(cbb);

    case CBS_ASN1_BOOLEAN: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_BOOLEAN boolean;
      if (!X509V3_bool_from_string(value, &boolean)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_BOOLEAN);
        return 0;
      }
      return CBB_add_u8(&child, boolean ? 0xff : 0x00) && CBB_flush(cbb);
    }

    case CBS_ASN1_INTEGER:
    case CBS_ASN1_ENUMERATED: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INTEGER_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_INTEGER *obj = s2i_ASN1_INTEGER(NULL, value);
      if (obj == NULL) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_INTEGER);
        return 0;
      }
      int len = i2c_ASN1_INTEGER(obj, NULL);
      uint8_t *out;
      int ok = len > 0 &&  //
               CBB_add_space(&child, &out, len) &&
               i2c_ASN1_INTEGER(obj, &out) == len && CBB_flush(cbb);
      ASN1_INTEGER_free(obj);
      return ok;
    }

    case CBS_ASN1_OBJECT: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_OBJECT_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_OBJECT *obj = OBJ_txt2obj(value, /*dont_search_names=*/0);
      if (obj == NULL || obj->length == 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OBJECT);
        return 0;
      }
      int ok = CBB_add_bytes(&child, obj->data, obj->length) && CBB_flush(cbb);
      ASN1_OBJECT_free(obj);
      return ok;
    }

    case CBS_ASN1_UTCTIME:
    case CBS_ASN1_GENERALIZEDTIME: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_TIME_NOT_ASCII_FORMAT);
        return 0;
      }
      CBS value_cbs;
      CBS_init(&value_cbs, (const uint8_t *)value, strlen(value));
      int ok = type == CBS_ASN1_UTCTIME
                   ? CBS_parse_utc_time(&value_cbs, NULL,
                                        /*allow_timezone_offset=*/0)
                   : CBS_parse_generalized_time(&value_cbs, NULL,
                                                /*allow_timezone_offset=*/0);
      if (!ok) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TIME_VALUE);
        return 0;
      }
      return CBB_add_bytes(&child, (const uint8_t *)value, strlen(value)) &&
             CBB_flush(cbb);
    }

    case CBS_ASN1_UNIVERSALSTRING:
    case CBS_ASN1_IA5STRING:
    case CBS_ASN1_UTF8STRING:
    case CBS_ASN1_BMPSTRING:
    case CBS_ASN1_PRINTABLESTRING:
    case CBS_ASN1_T61STRING: {
      int encoding;
      if (format == ASN1_GEN_FORMAT_ASCII) {
        encoding = MBSTRING_ASC;
      } else if (format == ASN1_GEN_FORMAT_UTF8) {
        encoding = MBSTRING_UTF8;
      } else {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_FORMAT);
        return 0;
      }

      // |maxsize| is measured in code points, rather than bytes, but pass it in
      // as a loose cap so fuzzers can exit from excessively long inputs
      // earlier. This limit is not load-bearing because |ASN1_mbstring_ncopy|'s
      // output is already linear in the input.
      ASN1_STRING *obj = NULL;
      if (ASN1_mbstring_ncopy(&obj, (const uint8_t *)value, -1, encoding,
                              ASN1_tag2bit(type), /*minsize=*/0,
                              /*maxsize=*/ASN1_GEN_MAX_OUTPUT) <= 0) {
        return 0;
      }
      int ok = CBB_add_bytes(&child, obj->data, obj->length) && CBB_flush(cbb);
      ASN1_STRING_free(obj);
      return ok;
    }

    case CBS_ASN1_BITSTRING:
      if (format == ASN1_GEN_FORMAT_BITLIST) {
        ASN1_BIT_STRING *obj = ASN1_BIT_STRING_new();
        if (obj == NULL) {
          return 0;
        }
        if (!CONF_parse_list(value, ',', 1, bitstr_cb, obj)) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_LIST_ERROR);
          ASN1_BIT_STRING_free(obj);
          return 0;
        }
        int len = i2c_ASN1_BIT_STRING(obj, NULL);
        uint8_t *out;
        int ok = len > 0 &&  //
                 CBB_add_space(&child, &out, len) &&
                 i2c_ASN1_BIT_STRING(obj, &out) == len &&  //
                 CBB_flush(cbb);
        ASN1_BIT_STRING_free(obj);
        return ok;
      }

      // The other formats are the same as OCTET STRING, but with the leading
      // zero bytes.
      if (!CBB_add_u8(&child, 0)) {
        return 0;
      }
      [[fallthrough]];

    case CBS_ASN1_OCTETSTRING:
      if (format == ASN1_GEN_FORMAT_ASCII) {
        return CBB_add_bytes(&child, (const uint8_t *)value, strlen(value)) &&
               CBB_flush(cbb);
      }
      if (format == ASN1_GEN_FORMAT_HEX) {
        size_t len;
        uint8_t *data = x509v3_hex_to_bytes(value, &len);
        if (data == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_HEX);
          return 0;
        }
        int ok = CBB_add_bytes(&child, data, len) && CBB_flush(cbb);
        OPENSSL_free(data);
        return ok;
      }

      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_BITSTRING_FORMAT);
      return 0;

    case CBS_ASN1_SEQUENCE:
    case CBS_ASN1_SET:
      if (has_value) {
        if (cnf == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_OR_SET_NEEDS_CONFIG);
          return 0;
        }
        const STACK_OF(CONF_VALUE) *section = X509V3_get_section(cnf, value);
        if (section == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_OR_SET_NEEDS_CONFIG);
          return 0;
        }
        for (size_t i = 0; i < sk_CONF_VALUE_num(section); i++) {
          const CONF_VALUE *conf = sk_CONF_VALUE_value(section, i);
          if (!generate_v3(&child, conf->value, cnf, /*tag=*/0,
                           ASN1_GEN_FORMAT_ASCII, depth + 1)) {
            return 0;
          }
          // This recursive call, by referencing |section|, is the one place
          // where |generate_v3|'s output can be super-linear in the input.
          // Check bounds here.
          if (CBB_len(&child) > ASN1_GEN_MAX_OUTPUT) {
            OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
            return 0;
          }
        }
      }
      if (type == CBS_ASN1_SET) {
        // The SET type here is a SET OF and must be sorted.
        return CBB_flush_asn1_set_of(&child) && CBB_flush(cbb);
      }
      return CBB_flush(cbb);

    default:
      OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
      return 0;
  }
}